

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

void key_list_callback(void *ctx,char **fingerprints,char *comment,uint32_t ext_flags,
                      pageant_pubkey *key)

{
  FingerprintType FVar1;
  char *pcStack_38;
  FingerprintType this_type;
  char *mode;
  pageant_pubkey *key_local;
  uint32_t ext_flags_local;
  char *comment_local;
  char **fingerprints_local;
  void *ctx_local;
  
  pcStack_38 = "";
  if ((ext_flags & 2) == 0) {
    if ((ext_flags & 1) != 0) {
      pcStack_38 = " (re-encryptable)";
    }
  }
  else {
    pcStack_38 = " (encrypted)";
  }
  FVar1 = ssh2_pick_fingerprint(fingerprints,key_list_fptype);
  printf("%s %s%s\n",fingerprints[FVar1],comment,pcStack_38);
  return;
}

Assistant:

void key_list_callback(void *ctx, char **fingerprints, const char *comment,
                       uint32_t ext_flags, struct pageant_pubkey *key)
{
    const char *mode = "";
    if (ext_flags & LIST_EXTENDED_FLAG_HAS_NO_CLEARTEXT_KEY)
        mode = " (encrypted)";
    else if (ext_flags & LIST_EXTENDED_FLAG_HAS_ENCRYPTED_KEY_FILE)
        mode = " (re-encryptable)";

    FingerprintType this_type =
        ssh2_pick_fingerprint(fingerprints, key_list_fptype);
    printf("%s %s%s\n", fingerprints[this_type], comment, mode);
}